

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O3

void __thiscall HFactor::reportAsm(HFactor *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar5 = this->num_row;
  if (0 < iVar5) {
    lVar8 = 1;
    do {
      iVar6 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (-1 < iVar6) {
        do {
          lVar10 = (long)iVar6;
          dVar1 = (this->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
          uVar2 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
          iVar5 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
          printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n",lVar10,lVar8,(ulong)uVar2)
          ;
          if (0 < iVar5) {
            lVar9 = (long)(int)uVar2;
            do {
              lVar11 = (long)(this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar9];
              uVar3 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
              pcVar7 = "";
              if (dVar1 <= ABS((this->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar9])) {
                pcVar7 = "OK";
              }
              printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
                     (double)(int)(uVar3 - 1) * (double)((int)lVar8 + -1),lVar11,(ulong)uVar3,pcVar7
                    );
              lVar9 = lVar9 + 1;
            } while (lVar9 < (int)(iVar5 + uVar2));
          }
          iVar6 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
        } while (iVar6 != -1);
        iVar5 = this->num_row;
      }
      bVar4 = lVar8 < iVar5;
      lVar8 = lVar8 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void HFactor::reportAsm() {
  for (HighsInt count = 1; count <= num_row; count++) {
    if (col_link_first[count] < 0) continue;
    for (HighsInt j = col_link_first[count]; j != -1; j = col_link_next[j]) {
      double min_pivot = mc_min_pivot[j];
      HighsInt start = mc_start[j];
      HighsInt end = start + mc_count_a[j];
      printf("Col %4d: count = %2d; min_pivot = %10.4g; [%4d, %4d)\n", (int)j,
             (int)count, min_pivot, (int)start, (int)end);
      for (HighsInt k = start; k < end; k++) {
        HighsInt i = mc_index[k];
        double value = mc_value[k];
        //	if (abs_value < 1e-8) continue;
        HighsInt row_count = mr_count[i];
        double merit_local = 1.0 * (count - 1) * (row_count - 1);
        printf("   Row %4d; Count = %2d; Merit = %11.4g; Value = %11.4g: %s\n",
               (int)i, (int)row_count, merit_local, value,
               std::abs(value) >= min_pivot ? "OK" : "");
      }
    }
  }
}